

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.cpp
# Opt level: O1

BoundStatement * __thiscall
duckdb::SecretManager::BindCreateSecret
          (BoundStatement *__return_storage_ptr__,SecretManager *this,CatalogTransaction transaction
          ,CreateSecretInput *info)

{
  pointer pcVar1;
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> _Var2;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> *p_Var3;
  BoundStatement *pBVar4;
  size_type sVar5;
  undefined8 uVar6;
  bool bVar7;
  size_t sVar8;
  iterator iVar9;
  mapped_type *this_00;
  BinderException *pBVar10;
  char *__s;
  _Hash_node_base *p_Var11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<duckdb::LogicalType> __l_00;
  BoundStatement *result;
  string type;
  string provider;
  string error_msg;
  optional_ptr<duckdb::CreateSecretFunction,_true> function;
  Value cast_value;
  string default_string;
  CreateSecretInput bound_info;
  allocator_type local_301;
  BoundStatement *local_300;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  optional_ptr<duckdb::CreateSecretFunction,_true> local_290;
  string local_288;
  Value local_268;
  undefined1 *local_220;
  long local_218;
  undefined1 local_210 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  LogicalType local_120;
  undefined1 local_108 [56];
  char local_d0 [16];
  _Alloc_hider local_c0;
  undefined1 local_b8 [8];
  char local_b0 [24];
  undefined1 local_98 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88 [24];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_70;
  
  local_300 = __return_storage_ptr__;
  InitializeSecrets(this,transaction);
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  pcVar1 = (info->type)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f8,pcVar1,pcVar1 + (info->type)._M_string_length);
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  pcVar1 = (info->provider)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d8,pcVar1,pcVar1 + (info->provider)._M_string_length);
  sVar5 = local_2d8._M_string_length;
  if (local_2d8._M_string_length == 0) {
    LookupTypeInternal((SecretType *)local_108,this,&local_2f8);
    ::std::__cxx11::string::_M_assign((string *)&local_2d8);
    if (local_c0._M_p != local_b0) {
      operator_delete(local_c0._M_p);
    }
    if ((char *)local_108._40_8_ != local_d0) {
      operator_delete((void *)local_108._40_8_);
    }
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_);
    }
    __s = "default ";
  }
  else {
    __s = anon_var_dwarf_4f001a4 + 9;
  }
  local_220 = local_210;
  sVar8 = strlen(__s);
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,__s,__s + sVar8);
  local_290 = LookupFunctionInternal(this,&local_2f8,&local_2d8);
  if (local_290.ptr == (CreateSecretFunction *)0x0) {
    ThrowProviderNotFoundError(this,&info->type,&info->provider,sVar5 == 0);
  }
  CreateSecretInput::CreateSecretInput((CreateSecretInput *)local_108,info);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&local_70);
  p_Var11 = (info->options)._M_h._M_before_begin._M_nxt;
  if (p_Var11 != (_Hash_node_base *)0x0) {
    do {
      optional_ptr<duckdb::CreateSecretFunction,_true>::CheckValid(&local_290);
      iVar9 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&((local_290.ptr)->named_parameters)._M_h,(key_type *)(p_Var11 + 1));
      optional_ptr<duckdb::CreateSecretFunction,_true>::CheckValid(&local_290);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
          ._M_cur == (__node_type *)0x0) {
        pBVar10 = (BinderException *)__cxa_allocate_exception(0x10);
        local_268.type_._0_8_ =
             &local_268.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,
                   "Unknown parameter \'%s\' for secret type \'%s\' with %sprovider \'%s\'","");
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_160,p_Var11[1]._M_nxt,
                   (long)&(p_Var11[1]._M_nxt)->_M_nxt + (long)&(p_Var11[2]._M_nxt)->_M_nxt);
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_180,local_2f8._M_dataplus._M_p,
                   local_2f8._M_dataplus._M_p + local_2f8._M_string_length);
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e0,local_220,local_220 + local_218);
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_200,local_2d8._M_dataplus._M_p,
                   local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
        BinderException::
        BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (pBVar10,(string *)&local_268,&local_160,&local_180,&local_1e0,&local_200);
        __cxa_throw(pBVar10,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      local_2b8._M_string_length = 0;
      local_2b8.field_2._M_allocated_capacity =
           local_2b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      LogicalType::LogicalType(&local_120,SQLNULL);
      Value::Value(&local_268,&local_120);
      LogicalType::~LogicalType(&local_120);
      bVar7 = Value::DefaultTryCastAs
                        ((Value *)(p_Var11 + 5),
                         (LogicalType *)
                         ((long)iVar9.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                                ._M_cur + 0x28),&local_268,&local_2b8,false);
      if (!bVar7) {
        pBVar10 = (BinderException *)__cxa_allocate_exception(0x10);
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_288,"Failed to cast option \'%s\' to type \'%s\': \'%s\'","");
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1a0,
                   *(long *)((long)iVar9.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                                   ._M_cur + 8),
                   *(long *)((long)iVar9.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                                   ._M_cur + 0x10) +
                   *(long *)((long)iVar9.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                                   ._M_cur + 8));
        LogicalType::ToString_abi_cxx11_
                  (&local_140,
                   (LogicalType *)
                   ((long)iVar9.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                          ._M_cur + 0x28));
        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c0,local_2b8._M_dataplus._M_p,
                   local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
        BinderException::
        BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (pBVar10,&local_288,&local_1a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_140,
                   &local_1c0);
        __cxa_throw(pBVar10,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      this_00 = ::std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&local_70,
                             (key_type *)
                             ((long)iVar9.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                                    ._M_cur + 8));
      Value::operator=(this_00,&local_268);
      Value::~Value(&local_268);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p);
      }
      p_Var11 = p_Var11->_M_nxt;
    } while (p_Var11 != (_Hash_node_base *)0x0);
  }
  (local_300->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_300->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_300->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_300->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_300->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
  (local_300->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_300->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var3 = (_Head_base<0UL,_duckdb::LogicalOperator_*,_false> *)
           &local_268.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_268.type_._0_8_ = p_Var3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"Success","");
  __l._M_len = 1;
  __l._M_array = (iterator)&local_268;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_288,__l,&local_301);
  local_2b8._M_dataplus._M_p =
       (pointer)(local_300->names).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_2b8._M_string_length =
       (size_type)
       (local_300->names).
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_2b8.field_2._M_allocated_capacity =
       (size_type)
       (local_300->names).
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (local_300->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_288._M_dataplus._M_p;
  (local_300->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_288._M_string_length;
  (local_300->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_288.field_2._M_allocated_capacity;
  local_288._M_dataplus._M_p = (pointer)0x0;
  local_288._M_string_length = 0;
  local_288.field_2._M_allocated_capacity = 0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2b8);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_288);
  if ((_Head_base<0UL,_duckdb::LogicalOperator_*,_false> *)local_268.type_._0_8_ != p_Var3) {
    operator_delete((void *)local_268.type_._0_8_);
  }
  LogicalType::LogicalType((LogicalType *)&local_288,BOOLEAN);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_288;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_2b8,__l_00,
             (allocator_type *)&local_301);
  pBVar4 = local_300;
  local_268.type_._0_8_ =
       (local_300->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_268.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_300->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_268.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (local_300->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (local_300->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_2b8._M_dataplus._M_p;
  (local_300->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_2b8._M_string_length;
  (local_300->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_2b8.field_2._M_allocated_capacity;
  local_2b8._M_dataplus._M_p = (pointer)0x0;
  local_2b8._M_string_length = 0;
  local_2b8.field_2._M_allocated_capacity = 0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_268);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_2b8);
  LogicalType::~LogicalType((LogicalType *)&local_288);
  make_uniq<duckdb::LogicalCreateSecret,duckdb::CreateSecretInput>
            ((duckdb *)&local_268,(CreateSecretInput *)local_108);
  uVar6 = local_268.type_._0_8_;
  local_268.type_._0_8_ = (LogicalOperator *)0x0;
  _Var2.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (pBVar4->plan).
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
  (pBVar4->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)uVar6;
  if (_Var2.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
      (LogicalOperator *)0x0) {
    (**(code **)(*(long *)_Var2.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl
                + 8))();
  }
  if ((LogicalOperator *)local_268.type_._0_8_ != (LogicalOperator *)0x0) {
    (**(code **)(*(long *)local_268.type_._0_8_ + 8))();
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_70);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_88);
  if ((undefined1 *)local_b0._8_8_ != local_98) {
    operator_delete((void *)local_b0._8_8_);
  }
  if ((undefined1 *)local_d0._8_8_ != local_b8) {
    operator_delete((void *)local_d0._8_8_);
  }
  if ((undefined1 *)local_108._32_8_ != local_108 + 0x30) {
    operator_delete((void *)local_108._32_8_);
  }
  if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
    operator_delete((void *)local_108._0_8_);
  }
  if (local_220 != local_210) {
    operator_delete(local_220);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  return local_300;
}

Assistant:

BoundStatement SecretManager::BindCreateSecret(CatalogTransaction transaction, CreateSecretInput &info) {
	InitializeSecrets(transaction);

	auto type = info.type;
	auto provider = info.provider;
	bool default_provider = false;

	if (provider.empty()) {
		default_provider = true;
		auto secret_type = LookupTypeInternal(type);
		provider = secret_type.default_provider;
	}

	string default_string = default_provider ? "default " : "";

	auto function = LookupFunctionInternal(type, provider);

	if (!function) {
		ThrowProviderNotFoundError(info.type, info.provider, default_provider);
	}

	auto bound_info = info;
	bound_info.options.clear();

	// We cast the passed parameters
	for (const auto &param : info.options) {
		auto matched_param = function->named_parameters.find(param.first);
		if (matched_param == function->named_parameters.end()) {
			throw BinderException("Unknown parameter '%s' for secret type '%s' with %sprovider '%s'", param.first, type,
			                      default_string, provider);
		}

		// Cast the provided value to the expected type
		string error_msg;
		Value cast_value;
		if (!param.second.DefaultTryCastAs(matched_param->second, cast_value, &error_msg)) {
			throw BinderException("Failed to cast option '%s' to type '%s': '%s'", matched_param->first,
			                      matched_param->second.ToString(), error_msg);
		}

		bound_info.options[matched_param->first] = {cast_value};
	}

	BoundStatement result;
	result.names = {"Success"};
	result.types = {LogicalType::BOOLEAN};
	result.plan = make_uniq<LogicalCreateSecret>(std::move(bound_info));
	return result;
}